

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

void boost::filesystem::detail::permissions(path *p,perms prms,error_code *ec)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  filesystem_error *pfVar5;
  uint *puVar6;
  error_code ec_00;
  error_code ec_01;
  error_code local_res0;
  file_status current_status;
  error_code local_58;
  detail local_48 [4];
  perms local_44;
  string local_40;
  
  if ((~prms & (remove_perms|add_perms)) == no_perms) {
    __assert_fail("(!((prms & add_perms) && (prms & remove_perms)))&&(\"add_perms and remove_perms are mutually exclusive\")"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x572,
                  "void boost::filesystem::detail::permissions(const path &, perms, system::error_code *)"
                 );
  }
  local_58.m_val = 0;
  local_58.m_cat = system::system_category();
  if ((prms >> 0xe & 1) == 0) {
    status(local_48,p,&local_58);
  }
  else {
    symlink_status(local_48,p,&local_58);
  }
  if (local_58.m_val == 0) {
    if ((prms >> 0xc & 1) == 0) {
      if ((prms >> 0xd & 1) != 0) {
        prms = ~prms & local_44;
      }
    }
    else {
      prms = prms | local_44;
    }
    iVar2 = chmod((p->m_pathname)._M_dataplus._M_p,prms & active_bits);
    if (iVar2 != 0) {
      if (ec == (error_code *)0x0) {
        pfVar5 = (filesystem_error *)__cxa_allocate_exception(0x50);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"boost::filesystem::permissions","");
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        peVar4 = system::generic_category();
        ec_01._4_4_ = 0;
        ec_01.m_val = uVar1;
        ec_01.m_cat = peVar4;
        filesystem_error::filesystem_error(pfVar5,&local_40,p,ec_01);
        __cxa_throw(pfVar5,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      peVar4 = system::generic_category();
      ec->m_val = iVar2;
      ec->m_cat = peVar4;
    }
  }
  else {
    if (ec == (error_code *)0x0) {
      pfVar5 = (filesystem_error *)__cxa_allocate_exception(0x50);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"boost::filesystem::permissions","");
      ec_00._4_4_ = 0;
      ec_00.m_val = local_58.m_val;
      ec_00.m_cat = local_58.m_cat;
      filesystem_error::filesystem_error(pfVar5,&local_40,p,ec_00);
      __cxa_throw(pfVar5,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    *(ulong *)ec = CONCAT44(local_58._4_4_,local_58.m_val);
    ec->m_cat = local_58.m_cat;
  }
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void permissions(const path& p, perms prms, system::error_code* ec)
  {
    BOOST_ASSERT_MSG(!((prms & add_perms) && (prms & remove_perms)),
      "add_perms and remove_perms are mutually exclusive");

    if ((prms & add_perms) && (prms & remove_perms))  // precondition failed
      return;

# ifdef BOOST_POSIX_API
    error_code local_ec;
    file_status current_status((prms & symlink_perms)
                               ? fs::symlink_status(p, local_ec)
                               : fs::status(p, local_ec));
    if (local_ec)
    {
      if (ec == 0)
      BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::permissions", p, local_ec));
      else
        *ec = local_ec;
      return;
    }

    if (prms & add_perms)
      prms |= current_status.permissions();
    else if (prms & remove_perms)
      prms = current_status.permissions() & ~prms;

    // OS X <10.10, iOS <8.0 and some other platforms don't support fchmodat().
    // Solaris (SunPro and gcc) only support fchmodat() on Solaris 11 and higher,
    // and a runtime check is too much trouble.
    // Linux does not support permissions on symbolic links and has no plans to
    // support them in the future.  The chmod() code is thus more practical,
    // rather than always hitting ENOTSUP when sending in AT_SYMLINK_NO_FOLLOW.
    //  - See the 3rd paragraph of
    // "Symbolic link ownership, permissions, and timestamps" at:
    //   "http://man7.org/linux/man-pages/man7/symlink.7.html"
    //  - See the fchmodat() Linux man page:
    //   "http://man7.org/linux/man-pages/man2/fchmodat.2.html"
#   if defined(AT_FDCWD) && defined(AT_SYMLINK_NOFOLLOW) \
      && !(defined(__SUNPRO_CC) || defined(__sun) || defined(sun)) \
      && !(defined(linux) || defined(__linux) || defined(__linux__)) \
      && !(defined(__MAC_OS_X_VERSION_MIN_REQUIRED) \
           && __MAC_OS_X_VERSION_MIN_REQUIRED < 101000) \
      && !(defined(__IPHONE_OS_VERSION_MIN_REQUIRED) \
           && __IPHONE_OS_VERSION_MIN_REQUIRED < 80000)
      if (::fchmodat(AT_FDCWD, p.c_str(), mode_cast(prms),
           !(prms & symlink_perms) ? 0 : AT_SYMLINK_NOFOLLOW))
#   else  // fallback if fchmodat() not supported
      if (::chmod(p.c_str(), mode_cast(prms)))
#   endif
    {
      if (ec == 0)
      BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::permissions", p,
          error_code(errno, system::generic_category())));
      else
        ec->assign(errno, system::generic_category());
    }

# else  // Windows

    // if not going to alter FILE_ATTRIBUTE_READONLY, just return
    if (!(!((prms & (add_perms | remove_perms)))
      || (prms & (owner_write|group_write|others_write))))
      return;

    DWORD attr = ::GetFileAttributesW(p.c_str());

    if (error(attr == 0 ? BOOST_ERRNO : 0, p, ec, "boost::filesystem::permissions"))
      return;

    if (prms & add_perms)
      attr &= ~FILE_ATTRIBUTE_READONLY;
    else if (prms & remove_perms)
      attr |= FILE_ATTRIBUTE_READONLY;
    else if (prms & (owner_write|group_write|others_write))
      attr &= ~FILE_ATTRIBUTE_READONLY;
    else
      attr |= FILE_ATTRIBUTE_READONLY;

    error(::SetFileAttributesW(p.c_str(), attr) == 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::permissions");
# endif
  }